

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonGroupInverse(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  void *pvVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  bVar3 = false;
  pvVar4 = sqlite3_aggregate_context(ctx,0);
  if (pvVar4 != (void *)0x0) {
    lVar2 = *(long *)((long)pvVar4 + 8);
    iVar5 = 1;
    while( true ) {
      lVar7 = (long)iVar5;
      cVar1 = *(char *)(lVar2 + lVar7);
      if ((cVar1 == ',') && (!bVar3)) break;
      if (cVar1 == '\\') {
        iVar5 = iVar5 + 1;
      }
      else if (cVar1 == '\"') {
        bVar3 = !bVar3;
      }
      iVar5 = iVar5 + 1;
    }
    lVar6 = *(long *)((long)pvVar4 + 0x18) - lVar7;
    *(long *)((long)pvVar4 + 0x18) = lVar6;
    memmove((void *)(lVar2 + 1),(void *)(lVar7 + lVar2 + 1),lVar6 - 1);
    return;
  }
  return;
}

Assistant:

static void jsonGroupInverse(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  int inStr = 0;
  char *z;
  JsonString *pStr;
  UNUSED_PARAM(argc);
  UNUSED_PARAM(argv);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, 0);
#ifdef NEVER
  /* pStr is always non-NULL since jsonArrayStep() or jsonObjectStep() will
  ** always have been called to initalize it */
  if( NEVER(!pStr) ) return;
#endif
  z = pStr->zBuf;
  for(i=1; z[i]!=',' || inStr; i++){
    assert( i<pStr->nUsed );
    if( z[i]=='"' ){
      inStr = !inStr;
    }else if( z[i]=='\\' ){
      i++;
    }
  }
  pStr->nUsed -= i;      
  memmove(&z[1], &z[i+1], (size_t)pStr->nUsed-1);
}